

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_COMMAND(effect_handler_context_t_conflict *context)

{
  uint32_t uVar1;
  uint32_t uVar2;
  wchar_t local_9c;
  wchar_t local_8c;
  char local_78 [8];
  char m_name [80];
  monster *mon;
  wchar_t amount;
  effect_handler_context_t_conflict *context_local;
  
  local_9c = effect_calculate_value(context,false);
  m_name._72_8_ = target_get_monster();
  context->ident = true;
  if ((monster *)m_name._72_8_ == (monster *)0x0) {
    msg("No monster selected!");
    context_local._7_1_ = false;
  }
  else {
    monster_wake((monster *)m_name._72_8_,false,L'd');
    uVar1 = Rand_div((int)player->lev);
    uVar2 = Rand_div(*(uint32_t *)(*(long *)m_name._72_8_ + 0x80));
    if ((int)(uVar1 + 1) < (int)(uVar2 + 1)) {
      monster_desc(local_78,0x50,(monster *)m_name._72_8_,L'̔');
      msg("%s resists your command!",local_78);
      context_local._7_1_ = true;
    }
    else {
      local_8c = local_9c;
      if (local_9c < L'\0') {
        local_8c = L'\0';
      }
      player_set_timed(player,L',',local_8c,false,false);
      if (local_9c < L'\0') {
        local_9c = L'\0';
      }
      mon_inc_timed((monster *)m_name._72_8_,L'\b',local_9c,L'\0');
      context_local._7_1_ = true;
    }
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_COMMAND(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	struct monster *mon = target_get_monster();

	context->ident = true;

	/* Need to choose a monster, not just point */
	if (!mon) {
		msg("No monster selected!");
		return false;
	}

	/* Wake up, become aware */
	monster_wake(mon, false, 100);

	/* Explicit saving throw */
	if (randint1(player->lev) < randint1(mon->race->level)) {
		char m_name[80];
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
		msg("%s resists your command!", m_name);
		/* Take a turn and deduct mana when the monster resists. */
		return true;
	}

	/* Player is commanding */
	player_set_timed(player, TMD_COMMAND, MAX(amount, 0), false, false);

	/* Monster is commanded */
	mon_inc_timed(mon, MON_TMD_COMMAND, MAX(amount, 0), 0);

	return true;
}